

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall dynet::EGTrainer::update_params(EGTrainer *this,real gscale,size_t idx)

{
  initializer_list<dynet::Tensor_*> __l;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *this_00;
  reference pvVar1;
  size_type in_RSI;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  value_type *p;
  vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *this_01;
  allocator_type *in_stack_ffffffffffffff88;
  Tensor *this_02;
  Tensor *pTVar2;
  undefined1 local_38 [24];
  const_reference local_20;
  size_type local_18;
  undefined4 local_c;
  
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  this_00 = ParameterCollection::parameters_list((ParameterCollection *)0xdb47a6);
  local_20 = std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::
             operator[](this_00,local_18);
  this_02 = &(*local_20)->values;
  pTVar2 = &(*local_20)->g;
  pvVar1 = std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::
           operator[]((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)
                      (in_RDI + 7),local_18);
  this_01 = (vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)&stack0xffffffffffffff8f;
  std::allocator<dynet::Tensor_*>::allocator((allocator<dynet::Tensor_*> *)0xdb4854);
  __l._M_len = (size_type)pvVar1;
  __l._M_array = (iterator)pTVar2;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)this_02,__l,
             in_stack_ffffffffffffff88);
  (**(code **)(*in_RDI + 0x28))(local_c,in_RDI,local_38);
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~vector(this_01);
  std::allocator<dynet::Tensor_*>::~allocator((allocator<dynet::Tensor_*> *)0xdb489e);
  return;
}

Assistant:

void EGTrainer::update_params(real gscale, size_t idx) {
  auto & p = model->parameters_list()[idx];
  update_rule(gscale, {&p->values, &p->g, &hp[idx].h, &meg, &zeg});
}